

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void cmExtraEclipseCDT4Generator::AddEnvVar(ostream *out,char *envVar,cmLocalGenerator *lg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar1;
  cmMakefile *this;
  bool bVar2;
  cmState *this_00;
  cmValue cVar3;
  long lVar4;
  cmake *this_01;
  string *path;
  size_t sVar5;
  ostream *poVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string envVarValue;
  string valueToUse;
  string cacheEntryName;
  string local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_80;
  size_t local_68;
  char *local_60;
  undefined8 local_58;
  string local_50;
  
  this = lg->Makefile;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  bVar2 = cmsys::SystemTools::GetEnv(envVar,&local_a0);
  local_80.first._M_len = 0x15;
  local_80.first._M_str = "CMAKE_ECLIPSE_ENVVAR_";
  local_80.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_68 = strlen(envVar);
  local_58 = 0;
  views._M_len = 2;
  views._M_array = &local_80;
  local_60 = envVar;
  cmCatViews(&local_50,views);
  this_00 = cmLocalGenerator::GetState(lg);
  cVar3 = cmState::GetInitializedCacheValue(this_00,&local_50);
  ppbVar1 = &local_80.second;
  local_80.first._M_str = (char *)0x0;
  local_80.second =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_80.second & 0xffffffffffffff00);
  local_80.first._M_len = (size_t)ppbVar1;
  if (bVar2) {
    if (cVar3.Value == (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&local_80);
      cmMakefile::AddCacheDefinition
                (this,&local_50,(string *)&local_80,(cmValue)&local_50,STRING,true);
      this_01 = cmMakefile::GetCMakeInstance(this);
      path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_80);
      lVar4 = std::__cxx11::string::find((char *)&local_80,(ulong)local_a0._M_dataplus._M_p,0);
      if (lVar4 != -1) goto LAB_00515034;
      std::__cxx11::string::_M_assign((string *)&local_80);
      cmMakefile::AddCacheDefinition
                (this,&local_50,(string *)&local_80,(cmValue)&local_50,STRING,true);
      this_01 = cmMakefile::GetCMakeInstance(this);
      path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
    }
    cmake::SaveCache(this_01,path);
  }
  else {
    if (cVar3.Value == (string *)0x0) goto LAB_005150aa;
    std::__cxx11::string::_M_assign((string *)&local_80);
  }
LAB_00515034:
  if (local_80.first._M_str != (char *)0x0) {
    if (envVar == (char *)0x0) {
      std::ios::clear((int)out + (int)out->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(envVar);
      std::__ostream_insert<char,std::char_traits<char>>(out,envVar,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"=",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_80.first._M_len,(long)local_80.first._M_str);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"|",1);
  }
LAB_005150aa:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_80.first._M_len !=
      ppbVar1) {
    operator_delete((void *)local_80.first._M_len,
                    (ulong)((long)&((local_80.second)->_M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(std::ostream& out,
                                            const char* envVar,
                                            cmLocalGenerator& lg)
{
  cmMakefile* mf = lg.GetMakefile();

  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  std::string envVarValue;
  const bool envVarSet = cmSystemTools::GetEnv(envVar, envVarValue);

  std::string cacheEntryName = cmStrCat("CMAKE_ECLIPSE_ENVVAR_", envVar);
  cmValue cacheValue = lg.GetState()->GetInitializedCacheValue(cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (!envVarSet && !cacheValue) {
    // nothing known, do nothing
    valueToUse.clear();
  } else if (envVarSet && !cacheValue) {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse, cacheEntryName,
                           cmStateEnums::STRING, true);
    mf->GetCMakeInstance()->SaveCache(lg.GetBinaryDirectory());
  } else if (!envVarSet && cacheValue) {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = *cacheValue;
  } else {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = *cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos) {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse, cacheEntryName,
                             cmStateEnums::STRING, true);
      mf->GetCMakeInstance()->SaveCache(lg.GetBinaryDirectory());
    }
  }

  if (!valueToUse.empty()) {
    out << envVar << "=" << valueToUse << "|";
  }
}